

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Minisat::sort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>(long array,int size)

{
  Lit y;
  undefined4 uVar1;
  bool bVar2;
  int local_30;
  int local_2c;
  int j;
  int i;
  Lit tmp;
  Lit pivot;
  int size_local;
  Lit *array_local;
  
  if (size < 0x10) {
    selectionSort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>(array,size);
  }
  else {
    y.x = *(int *)(array + (long)(size / 2) * 4);
    local_2c = -1;
    local_30 = size;
    while( true ) {
      do {
        local_2c = local_2c + 1;
        bVar2 = LessThan_default<Minisat::Lit>::operator()
                          ((LessThan_default<Minisat::Lit> *)((long)&array_local + 7),
                           (Lit)*(int *)(array + (long)local_2c * 4),y);
      } while (bVar2);
      do {
        local_30 = local_30 + -1;
        bVar2 = LessThan_default<Minisat::Lit>::operator()
                          ((LessThan_default<Minisat::Lit> *)((long)&array_local + 7),y,
                           (Lit)*(int *)(array + (long)local_30 * 4));
      } while (bVar2);
      if (local_30 <= local_2c) break;
      uVar1 = *(undefined4 *)(array + (long)local_2c * 4);
      *(undefined4 *)(array + (long)local_2c * 4) = *(undefined4 *)(array + (long)local_30 * 4);
      *(undefined4 *)(array + (long)local_30 * 4) = uVar1;
    }
    sort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>(array,local_2c);
    sort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>
              (array + (long)local_2c * 4,size - local_2c);
  }
  return;
}

Assistant:

void sort(T* array, int size, LessThan lt)
{
    if (size <= 15)
        selectionSort(array, size, lt);

    else{
        T           pivot = array[size / 2];
        T           tmp;
        int         i = -1;
        int         j = size;

        for(;;){
            do i++; while(lt(array[i], pivot));
            do j--; while(lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }

        sort(array    , i     , lt);
        sort(&array[i], size-i, lt);
    }
}